

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<solitaire::graphics::TextureId>,testing::Matcher<solitaire::geometry::Position_const&>,testing::Matcher<solitaire::geometry::Area_const&>>,std::tuple<solitaire::graphics::TextureId,solitaire::geometry::Position_const&,solitaire::geometry::Area_const&>>
               (tuple<testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
                *matcher_tuple,
               tuple<solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>
               *value_tuple)

{
  bool bVar1;
  MatchResultListener local_28;
  
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_003183f8;
  bVar1 = MatcherBase<solitaire::graphics::TextureId>::MatchAndExplain
                    ((MatcherBase<solitaire::graphics::TextureId> *)
                     &(matcher_tuple->
                      super__Tuple_impl<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
                      ).
                      super__Head_base<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_false>
                     ,&(value_tuple->
                       super__Tuple_impl<0UL,_solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>
                       ).super__Head_base<0UL,_solitaire::graphics::TextureId,_false>._M_head_impl,
                     &local_28);
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_003183f8;
    bVar1 = MatcherBase<const_solitaire::geometry::Position_&>::MatchAndExplain
                      ((MatcherBase<const_solitaire::geometry::Position_&> *)
                       &(matcher_tuple->
                        super__Tuple_impl<0UL,_testing::Matcher<solitaire::graphics::TextureId>,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
                        ).
                        super__Tuple_impl<1UL,_testing::Matcher<const_solitaire::geometry::Position_&>,_testing::Matcher<const_solitaire::geometry::Area_&>_>
                        .
                        super__Head_base<1UL,_testing::Matcher<const_solitaire::geometry::Position_&>,_false>
                       ,(value_tuple->
                        super__Tuple_impl<0UL,_solitaire::graphics::TextureId,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>
                        ).
                        super__Tuple_impl<1UL,_const_solitaire::geometry::Position_&,_const_solitaire::geometry::Area_&>
                        .super__Head_base<1UL,_const_solitaire::geometry::Position_&,_false>.
                        _M_head_impl,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple) &&
           std::get<N - 1>(matcher_tuple).Matches(std::get<N - 1>(value_tuple));
  }